

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tsqueue.h
# Opt level: O2

__pid_t __thiscall
blcl::net::tsqueue<blcl::net::owned_message<MsgType>_>::wait
          (tsqueue<blcl::net::owned_message<MsgType>_> *this,void *__stat_loc)

{
  bool bVar1;
  undefined3 extraout_var;
  unique_lock<std::mutex> lk;
  unique_lock<std::mutex> local_30;
  
  while( true ) {
    bVar1 = empty(this);
    if (!bVar1) break;
    std::unique_lock<std::mutex>::unique_lock(&local_30,&this->to_update_mtx_);
    std::condition_variable::wait((unique_lock *)&this->to_update_cv_);
    std::unique_lock<std::mutex>::~unique_lock(&local_30);
  }
  return CONCAT31(extraout_var,bVar1);
}

Assistant:

void wait() {
            while (empty()) {
                std::unique_lock<std::mutex> lk(to_update_mtx_);
                to_update_cv_.wait(lk);
            }
        }